

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_utilities.cpp
# Opt level: O0

void ShaderUtilities::attach_point_light(GLuint p_shader_id,PointLight *point_light)

{
  GLuint GVar1;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  vec<3,_float,_(glm::qualifier)0> local_d0;
  allocator<char> local_c1;
  string local_c0;
  vec<3,_float,_(glm::qualifier)0> local_a0;
  allocator<char> local_91;
  string local_90;
  vec<3,_float,_(glm::qualifier)0> local_70;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_39;
  string local_38;
  PointLight *local_18;
  PointLight *point_light_local;
  GLuint p_shader_id_local;
  
  local_18 = point_light;
  point_light_local._4_4_ = p_shader_id;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"point_light.position",&local_39);
  setVec3(p_shader_id,&local_38,&local_18->m_position);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  GVar1 = point_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"point_light.ambient",&local_61);
  if ((LightingDbWindow::enable_point_light & 1) == 0) {
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_70,0.0);
  }
  else {
    local_70.field_0 = (local_18->m_phong).m_ambient.field_0;
    local_70.field_1 = (local_18->m_phong).m_ambient.field_1;
    local_70.field_2 = (local_18->m_phong).m_ambient.field_2;
  }
  setVec3(GVar1,&local_60,&local_70);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  GVar1 = point_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"point_light.diffuse",&local_91);
  if ((LightingDbWindow::enable_point_light & 1) == 0) {
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_a0,0.0);
  }
  else {
    local_a0.field_0 = (local_18->m_phong).m_diffuse.field_0;
    local_a0.field_1 = (local_18->m_phong).m_diffuse.field_1;
    local_a0.field_2 = (local_18->m_phong).m_diffuse.field_2;
  }
  setVec3(GVar1,&local_90,&local_a0);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  GVar1 = point_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"point_light.specular",&local_c1);
  if ((LightingDbWindow::enable_point_light & 1) == 0) {
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_d0,0.0);
  }
  else {
    local_d0.field_0 = (local_18->m_phong).m_specular.field_0;
    local_d0.field_1 = (local_18->m_phong).m_specular.field_1;
    local_d0.field_2 = (local_18->m_phong).m_specular.field_2;
  }
  setVec3(GVar1,&local_c0,&local_d0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  GVar1 = point_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"point_light.attenuation_value",&local_f1);
  setFloat(GVar1,&local_f0,(local_18->m_intensity).m_attval);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  GVar1 = point_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"point_light.constant",&local_119);
  setFloat(GVar1,&local_118,(local_18->m_intensity).m_constant);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  GVar1 = point_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"point_light.linear",&local_141);
  setFloat(GVar1,&local_140,(local_18->m_intensity).m_linear);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  GVar1 = point_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"point_light.quadratic",&local_169);
  setFloat(GVar1,&local_168,(local_18->m_intensity).m_quadratic);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  GVar1 = point_light_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"depth_map",&local_191);
  setInt(GVar1,&local_190,4);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  (*glad_glActiveTexture)(0x84c4);
  (*glad_glBindTexture)(0x8513,(local_18->m_buffer).m_cube_map);
  return;
}

Assistant:

void ShaderUtilities::attach_point_light(
    const GLuint p_shader_id,
    const PointLight &point_light) noexcept
{
    setVec3(
        p_shader_id,
        "point_light.position",
        point_light.m_position);
    setVec3(
        p_shader_id,
        "point_light.ambient",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_ambient
                                             : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "point_light.diffuse",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_diffuse
                                             : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "point_light.specular",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_specular
                                             : glm::vec3(0.0f));
    setFloat(
        p_shader_id,
        "point_light.attenuation_value",
        point_light.m_intensity.m_attval);
    setFloat(
        p_shader_id,
        "point_light.constant",
        point_light.m_intensity.m_constant);
    setFloat(
        p_shader_id,
        "point_light.linear",
        point_light.m_intensity.m_linear);
    setFloat(
        p_shader_id,
        "point_light.quadratic",
        point_light.m_intensity.m_quadratic);
    ShaderUtilities::setInt(
        p_shader_id,
        "depth_map",
        4);
    glActiveTexture(GL_TEXTURE4);
    glBindTexture(GL_TEXTURE_CUBE_MAP, point_light.m_buffer.m_cube_map);
}